

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackNSISGenerator.cxx
# Opt level: O0

int __thiscall cmCPackNSISGenerator::PackageFiles(cmCPackNSISGenerator *this)

{
  OutputOption outputflag;
  cmCPackLog *pcVar1;
  cmCPackInstallationType *pcVar2;
  bool bVar3;
  ulong uVar4;
  char *pcVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  ostream *poVar6;
  reference remote;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  mapped_type *pmVar7;
  size_type __n;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackInstallationType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackInstallationType>_>_>
  *this_01;
  reference ppVar8;
  reference ppcVar9;
  reference ppcVar10;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>_>_>
  *this_02;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
  *this_03;
  byte local_23e1;
  bool local_2262;
  string local_2130 [32];
  undefined1 local_2110 [8];
  ostringstream cmCPackLog_msg_6;
  undefined1 local_1f98 [8];
  cmGeneratedFileStream ofs;
  int local_1d44;
  undefined1 local_1d40 [3];
  bool res;
  int retVal;
  string output;
  undefined1 local_1d00 [8];
  ostringstream cmCPackLog_msg_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b68;
  allocator<char> local_1b41;
  string local_1b40;
  allocator<char> local_1b19;
  undefined1 local_1b18 [8];
  string nsisCmd;
  string local_1af0;
  allocator<char> local_1ac9;
  string local_1ac8;
  allocator<char> local_1aa1;
  string local_1aa0;
  allocator<char> local_1a79;
  string local_1a78;
  allocator<char> local_1a51;
  string local_1a50;
  allocator<char> local_1a29;
  string local_1a28;
  allocator<char> local_1a01;
  string local_1a00;
  allocator<char> local_19d9;
  string local_19d8;
  allocator<char> local_19b1;
  string local_19b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1990;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1970;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1950;
  allocator<char> local_1929;
  string local_1928;
  string local_1908 [32];
  string local_18e8;
  string local_18c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_18a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1888;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1868;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1848;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1828;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1808;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_17e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_17c8;
  string local_17a8;
  reference local_1788;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>
  *comp;
  iterator __end2_3;
  iterator __begin2_3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
  *__range2_3;
  string local_1748;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1728;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1708;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_16e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_16c8;
  string local_16a8;
  reference local_1688;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>
  *group;
  iterator __end2_2;
  iterator __begin2_2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>_>_>
  *__range2_2;
  cmCPackInstallationType *installType_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_> *__range2_1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackInstallationType>
  *installType;
  iterator __end2;
  iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackInstallationType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackInstallationType>_>_>
  *__range2;
  undefined1 local_1620 [8];
  vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_> installTypes;
  undefined1 local_1600 [7];
  bool anyDownloadedComponents;
  ostringstream macrosOut;
  string local_1488 [8];
  string defines;
  string installTypesCode;
  string groupDescriptions;
  string componentDescriptions;
  string selectedVarsList;
  string sectionList;
  string componentCode;
  string local_13a0;
  allocator<char> local_1379;
  string local_1378;
  allocator<char> local_1351;
  string local_1350;
  allocator<char> local_1329;
  string local_1328;
  allocator<char> local_1301;
  string local_1300;
  allocator<char> local_12d9;
  string local_12d8;
  allocator<char> local_12b1;
  string local_12b0;
  allocator<char> local_1289;
  string local_1288;
  allocator<char> local_1261;
  string local_1260;
  allocator<char> local_1239;
  string local_1238;
  allocator<char> local_1211;
  string local_1210 [8];
  string installerRunCode;
  string local_11e8;
  allocator<char> local_11c1;
  string local_11c0;
  allocator<char> local_1199;
  string local_1198;
  allocator<char> local_1171;
  string local_1170 [8];
  string installerBitmapCode_1;
  string local_1148;
  allocator<char> local_1121;
  string local_1120;
  allocator<char> local_10f9;
  string local_10f8;
  allocator<char> local_10d1;
  string local_10d0 [8];
  string installerBitmapCode;
  string local_10a8;
  allocator<char> local_1081;
  string local_1080;
  allocator<char> local_1059;
  string local_1058;
  allocator<char> local_1031;
  string local_1030 [8];
  string installerIconCode_1;
  string local_1008;
  allocator<char> local_fe1;
  string local_fe0;
  allocator<char> local_fb9;
  string local_fb8;
  allocator<char> local_f91;
  string local_f90;
  allocator<char> local_f69;
  string local_f68;
  allocator<char> local_f41;
  string local_f40;
  string local_f20 [8];
  string installerIconCode;
  string local_ef8;
  allocator<char> local_ed1;
  string local_ed0;
  string local_eb0 [32];
  undefined1 local_e90 [8];
  ostringstream cmCPackLog_msg_4;
  string local_d18 [39];
  allocator<char> local_cf1;
  string local_cf0;
  string local_cd0 [32];
  string local_cb0 [32];
  undefined1 local_c90 [8];
  ostringstream cmCPackLog_msg_3;
  undefined1 local_b18 [8];
  string componentOutputDir;
  string local_ae0 [32];
  string local_ac0 [32];
  long local_aa0;
  size_type slash;
  string fileN_1;
  string componentName_1;
  string *dir;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  ostringstream dstr;
  undefined1 local_8c0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dirs;
  allocator<char> local_881;
  string local_880;
  string local_860 [32];
  string local_840 [32];
  undefined1 local_820 [8];
  ostringstream cmCPackLog_msg_2;
  char local_6a2 [2];
  char *local_6a0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_698;
  string local_690 [32];
  string local_670;
  string local_650;
  undefined1 local_630 [8];
  string componentName;
  size_type pos;
  string fileN;
  string local_5e0 [8];
  string outputDir;
  string *file;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  ostringstream str;
  undefined1 local_428 [8];
  string nsisInstallOptions;
  string tmpFile;
  string local_3e0;
  undefined1 local_3c0 [8];
  string nsisFileName;
  undefined1 local_380 [8];
  ostringstream cmCPackLog_msg_1;
  string local_208 [8];
  string nsisInInstallOptions;
  string local_1e0 [48];
  undefined1 local_1b0 [8];
  ostringstream cmCPackLog_msg;
  string local_38 [8];
  string nsisInFileName;
  cmCPackNSISGenerator *this_local;
  
  nsisInFileName.field_2._8_8_ = this;
  (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[0xc])(local_38,this,"NSIS.template.in");
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[0xc])
              (local_208,this,"NSIS.InstallOptions.ini.in");
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3e0,"CPACK_TOPLEVEL_DIRECTORY",
                 (allocator<char> *)(tmpFile.field_2._M_local_buf + 0xf));
      pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_3e0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_3c0,pcVar5,(allocator<char> *)(tmpFile.field_2._M_local_buf + 0xe))
      ;
      std::allocator<char>::~allocator((allocator<char> *)(tmpFile.field_2._M_local_buf + 0xe));
      std::__cxx11::string::~string((string *)&local_3e0);
      std::allocator<char>::~allocator((allocator<char> *)(tmpFile.field_2._M_local_buf + 0xf));
      std::__cxx11::string::string
                ((string *)(nsisInstallOptions.field_2._M_local_buf + 8),(string *)local_3c0);
      std::__cxx11::string::operator+=
                ((string *)(nsisInstallOptions.field_2._M_local_buf + 8),"/NSISOutput.log");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_428,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0,
                     "/NSIS.InstallOptions.ini");
      std::__cxx11::string::operator+=((string *)local_3c0,"/project.nsi");
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&__range1);
      this_00 = &(this->super_cmCPackGenerator).files;
      __end1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(this_00);
      file = (string *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(this_00);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&file), bVar3) {
        outputDir.field_2._8_8_ =
             __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_5e0,"$INSTDIR",(allocator<char> *)(fileN.field_2._M_local_buf + 0xf));
        std::allocator<char>::~allocator((allocator<char> *)(fileN.field_2._M_local_buf + 0xf));
        cmSystemTools::RelativePath
                  ((string *)&pos,&(this->super_cmCPackGenerator).toplevel,
                   (string *)outputDir.field_2._8_8_);
        bVar3 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
                ::empty(&(this->super_cmCPackGenerator).Components);
        if (!bVar3) {
          componentName.field_2._8_8_ = std::__cxx11::string::find((char)&pos,0x2f);
          if (componentName.field_2._8_8_ == -1) {
            CustomComponentInstallDirectory(&local_670,this,(string *)&pos);
            std::__cxx11::string::operator=(local_5e0,(string *)&local_670);
            std::__cxx11::string::~string((string *)&local_670);
          }
          else {
            std::__cxx11::string::substr((ulong)local_630,(ulong)&pos);
            CustomComponentInstallDirectory(&local_650,this,(string *)local_630);
            std::__cxx11::string::operator=(local_5e0,(string *)&local_650);
            std::__cxx11::string::~string((string *)&local_650);
            std::__cxx11::string::~string((string *)local_630);
          }
          std::__cxx11::string::substr((ulong)local_690,(ulong)&pos);
          std::__cxx11::string::operator=((string *)&pos,local_690);
          std::__cxx11::string::~string(local_690);
        }
        local_698._M_current = (char *)std::__cxx11::string::begin();
        local_6a0 = (char *)std::__cxx11::string::end();
        local_6a2[1] = 0x2f;
        local_6a2[0] = '\\';
        std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                  (local_698,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )local_6a0,local_6a2 + 1,local_6a2);
        poVar6 = std::operator<<((ostream *)&__range1,"  Delete \"");
        poVar6 = std::operator<<(poVar6,local_5e0);
        poVar6 = std::operator<<(poVar6,"\\");
        poVar6 = std::operator<<(poVar6,(string *)&pos);
        poVar6 = std::operator<<(poVar6,"\"");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)&pos);
        std::__cxx11::string::~string(local_5e0);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end1);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_820);
      poVar6 = std::operator<<((ostream *)local_820,"Uninstall Files: ");
      std::__cxx11::ostringstream::str();
      poVar6 = std::operator<<(poVar6,local_840);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_840);
      pcVar1 = (this->super_cmCPackGenerator).Logger;
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmCPackLog::Log(pcVar1,4,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackNSISGenerator.cxx"
                      ,0x53,pcVar5);
      std::__cxx11::string::~string(local_860);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_820);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_880,"CPACK_NSIS_DELETE_FILES",&local_881);
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmCPackGenerator::SetOptionIfNotSet(&this->super_cmCPackGenerator,&local_880,pcVar5);
      std::__cxx11::string::~string
                ((string *)
                 &dirs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string((string *)&local_880);
      std::allocator<char>::~allocator(&local_881);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_8c0);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      GetListOfSubdirectories
                (this,pcVar5,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_8c0);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&__range1_1);
      __end1_1 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_8c0);
      dir = (string *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_8c0);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end1_1,
                                (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&dir), bVar3) {
        remote = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end1_1);
        std::__cxx11::string::string((string *)(fileN_1.field_2._M_local_buf + 8));
        cmSystemTools::RelativePath
                  ((string *)&slash,&(this->super_cmCPackGenerator).toplevel,remote);
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) {
          bVar3 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
                  ::empty(&(this->super_cmCPackGenerator).Components);
          if ((!bVar3) &&
             (local_aa0 = std::__cxx11::string::find((char)&slash,0x2f), local_aa0 != -1)) {
            std::__cxx11::string::substr((ulong)local_ac0,(ulong)&slash);
            std::__cxx11::string::operator=((string *)(fileN_1.field_2._M_local_buf + 8),local_ac0);
            std::__cxx11::string::~string(local_ac0);
            std::__cxx11::string::substr((ulong)local_ae0,(ulong)&slash);
            std::__cxx11::string::operator=((string *)&slash,local_ae0);
            std::__cxx11::string::~string(local_ae0);
          }
          __first._M_current = (char *)std::__cxx11::string::begin();
          __last._M_current = (char *)std::__cxx11::string::end();
          componentOutputDir.field_2._M_local_buf[0xf] = '/';
          componentOutputDir.field_2._M_local_buf[0xe] = '\\';
          std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                    (__first,__last,componentOutputDir.field_2._M_local_buf + 0xf,
                     componentOutputDir.field_2._M_local_buf + 0xe);
          CustomComponentInstallDirectory
                    ((string *)local_b18,this,(string *)((long)&fileN_1.field_2 + 8));
          poVar6 = std::operator<<((ostream *)&__range1_1,"  RMDir \"");
          poVar6 = std::operator<<(poVar6,(string *)local_b18);
          poVar6 = std::operator<<(poVar6,"\\");
          poVar6 = std::operator<<(poVar6,(string *)&slash);
          poVar6 = std::operator<<(poVar6,"\"");
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          uVar4 = std::__cxx11::string::empty();
          if ((uVar4 & 1) == 0) {
            pmVar7 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
                     ::operator[](&(this->super_cmCPackGenerator).Components,
                                  (key_type *)((long)&fileN_1.field_2 + 8));
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&pmVar7->Directories,(value_type *)&slash);
          }
          std::__cxx11::string::~string((string *)local_b18);
          nsisInInstallOptions.field_2._12_4_ = 0;
        }
        else {
          nsisInInstallOptions.field_2._12_4_ = 0xb;
        }
        std::__cxx11::string::~string((string *)&slash);
        std::__cxx11::string::~string((string *)(fileN_1.field_2._M_local_buf + 8));
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end1_1);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c90);
      poVar6 = std::operator<<((ostream *)local_c90,"Uninstall Dirs: ");
      std::__cxx11::ostringstream::str();
      poVar6 = std::operator<<(poVar6,local_cb0);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_cb0);
      pcVar1 = (this->super_cmCPackGenerator).Logger;
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmCPackLog::Log(pcVar1,4,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackNSISGenerator.cxx"
                      ,0x77,pcVar5);
      std::__cxx11::string::~string(local_cd0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_c90);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_cf0,"CPACK_NSIS_DELETE_DIRECTORIES",&local_cf1);
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmCPackGenerator::SetOptionIfNotSet(&this->super_cmCPackGenerator,&local_cf0,pcVar5);
      std::__cxx11::string::~string(local_d18);
      std::__cxx11::string::~string((string *)&local_cf0);
      std::allocator<char>::~allocator(&local_cf1);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_e90);
      poVar6 = std::operator<<((ostream *)local_e90,"Configure file: ");
      poVar6 = std::operator<<(poVar6,local_38);
      poVar6 = std::operator<<(poVar6," to ");
      poVar6 = std::operator<<(poVar6,(string *)local_3c0);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCPackGenerator).Logger;
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmCPackLog::Log(pcVar1,2,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackNSISGenerator.cxx"
                      ,0x7c,pcVar5);
      std::__cxx11::string::~string(local_eb0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_e90);
      std::allocator<char>::allocator();
      installerIconCode.field_2._M_local_buf[0xe] = '\0';
      installerIconCode.field_2._M_local_buf[0xd] = '\0';
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_ed0,"CPACK_NSIS_MUI_ICON",&local_ed1);
      bVar3 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&local_ed0);
      local_2262 = true;
      if (!bVar3) {
        std::allocator<char>::allocator();
        installerIconCode.field_2._M_local_buf[0xe] = '\x01';
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_ef8,"CPACK_NSIS_MUI_UNIICON",
                   (allocator<char> *)(installerIconCode.field_2._M_local_buf + 0xf));
        installerIconCode.field_2._M_local_buf[0xd] = '\x01';
        local_2262 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&local_ef8);
      }
      if ((installerIconCode.field_2._M_local_buf[0xd] & 1U) != 0) {
        std::__cxx11::string::~string((string *)&local_ef8);
      }
      if ((installerIconCode.field_2._M_local_buf[0xe] & 1U) != 0) {
        std::allocator<char>::~allocator
                  ((allocator<char> *)(installerIconCode.field_2._M_local_buf + 0xf));
      }
      std::__cxx11::string::~string((string *)&local_ed0);
      std::allocator<char>::~allocator(&local_ed1);
      if (local_2262 != false) {
        std::__cxx11::string::string(local_f20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f40,"CPACK_NSIS_MUI_ICON",&local_f41);
        bVar3 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&local_f40);
        std::__cxx11::string::~string((string *)&local_f40);
        std::allocator<char>::~allocator(&local_f41);
        if (bVar3) {
          std::__cxx11::string::operator+=(local_f20,"!define MUI_ICON \"");
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_f68,"CPACK_NSIS_MUI_ICON",&local_f69);
          pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_f68);
          std::__cxx11::string::operator+=(local_f20,pcVar5);
          std::__cxx11::string::~string((string *)&local_f68);
          std::allocator<char>::~allocator(&local_f69);
          std::__cxx11::string::operator+=(local_f20,"\"\n");
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f90,"CPACK_NSIS_MUI_UNIICON",&local_f91);
        bVar3 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&local_f90);
        std::__cxx11::string::~string((string *)&local_f90);
        std::allocator<char>::~allocator(&local_f91);
        if (bVar3) {
          std::__cxx11::string::operator+=(local_f20,"!define MUI_UNICON \"");
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_fb8,"CPACK_NSIS_MUI_UNIICON",&local_fb9);
          pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_fb8);
          std::__cxx11::string::operator+=(local_f20,pcVar5);
          std::__cxx11::string::~string((string *)&local_fb8);
          std::allocator<char>::~allocator(&local_fb9);
          std::__cxx11::string::operator+=(local_f20,"\"\n");
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_fe0,"CPACK_NSIS_INSTALLER_MUI_ICON_CODE",&local_fe1);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        cmCPackGenerator::SetOptionIfNotSet(&this->super_cmCPackGenerator,&local_fe0,pcVar5);
        std::__cxx11::string::~string((string *)&local_fe0);
        std::allocator<char>::~allocator(&local_fe1);
        std::__cxx11::string::~string(local_f20);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1008,"CPACK_PACKAGE_ICON",
                 (allocator<char> *)(installerIconCode_1.field_2._M_local_buf + 0xf));
      bVar3 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&local_1008);
      std::__cxx11::string::~string((string *)&local_1008);
      std::allocator<char>::~allocator
                ((allocator<char> *)(installerIconCode_1.field_2._M_local_buf + 0xf));
      if (bVar3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_1030,"!define MUI_HEADERIMAGE_BITMAP \"",&local_1031);
        std::allocator<char>::~allocator(&local_1031);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1058,"CPACK_PACKAGE_ICON",&local_1059);
        pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_1058);
        std::__cxx11::string::operator+=(local_1030,pcVar5);
        std::__cxx11::string::~string((string *)&local_1058);
        std::allocator<char>::~allocator(&local_1059);
        std::__cxx11::string::operator+=(local_1030,"\"\n");
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1080,"CPACK_NSIS_INSTALLER_ICON_CODE",&local_1081);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        cmCPackGenerator::SetOptionIfNotSet(&this->super_cmCPackGenerator,&local_1080,pcVar5);
        std::__cxx11::string::~string((string *)&local_1080);
        std::allocator<char>::~allocator(&local_1081);
        std::__cxx11::string::~string(local_1030);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_10a8,"CPACK_NSIS_MUI_WELCOMEFINISHPAGE_BITMAP",
                 (allocator<char> *)(installerBitmapCode.field_2._M_local_buf + 0xf));
      bVar3 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&local_10a8);
      std::__cxx11::string::~string((string *)&local_10a8);
      std::allocator<char>::~allocator
                ((allocator<char> *)(installerBitmapCode.field_2._M_local_buf + 0xf));
      if (bVar3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_10d0,"!define MUI_WELCOMEFINISHPAGE_BITMAP \"",&local_10d1);
        std::allocator<char>::~allocator(&local_10d1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_10f8,"CPACK_NSIS_MUI_WELCOMEFINISHPAGE_BITMAP",&local_10f9);
        pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_10f8);
        std::__cxx11::string::operator+=(local_10d0,pcVar5);
        std::__cxx11::string::~string((string *)&local_10f8);
        std::allocator<char>::~allocator(&local_10f9);
        std::__cxx11::string::operator+=(local_10d0,"\"\n");
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1120,"CPACK_NSIS_INSTALLER_MUI_WELCOMEFINISH_CODE",&local_1121);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        cmCPackGenerator::SetOptionIfNotSet(&this->super_cmCPackGenerator,&local_1120,pcVar5);
        std::__cxx11::string::~string((string *)&local_1120);
        std::allocator<char>::~allocator(&local_1121);
        std::__cxx11::string::~string(local_10d0);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1148,"CPACK_NSIS_MUI_UNWELCOMEFINISHPAGE_BITMAP",
                 (allocator<char> *)(installerBitmapCode_1.field_2._M_local_buf + 0xf));
      bVar3 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&local_1148);
      std::__cxx11::string::~string((string *)&local_1148);
      std::allocator<char>::~allocator
                ((allocator<char> *)(installerBitmapCode_1.field_2._M_local_buf + 0xf));
      if (bVar3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_1170,"!define MUI_UNWELCOMEFINISHPAGE_BITMAP \"",&local_1171);
        std::allocator<char>::~allocator(&local_1171);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1198,"CPACK_NSIS_MUI_UNWELCOMEFINISHPAGE_BITMAP",&local_1199);
        pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_1198);
        std::__cxx11::string::operator+=(local_1170,pcVar5);
        std::__cxx11::string::~string((string *)&local_1198);
        std::allocator<char>::~allocator(&local_1199);
        std::__cxx11::string::operator+=(local_1170,"\"\n");
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_11c0,"CPACK_NSIS_INSTALLER_MUI_UNWELCOMEFINISH_CODE",&local_11c1
                  );
        pcVar5 = (char *)std::__cxx11::string::c_str();
        cmCPackGenerator::SetOptionIfNotSet(&this->super_cmCPackGenerator,&local_11c0,pcVar5);
        std::__cxx11::string::~string((string *)&local_11c0);
        std::allocator<char>::~allocator(&local_11c1);
        std::__cxx11::string::~string(local_1170);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_11e8,"CPACK_NSIS_MUI_FINISHPAGE_RUN",
                 (allocator<char> *)(installerRunCode.field_2._M_local_buf + 0xf));
      bVar3 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&local_11e8);
      std::__cxx11::string::~string((string *)&local_11e8);
      std::allocator<char>::~allocator
                ((allocator<char> *)(installerRunCode.field_2._M_local_buf + 0xf));
      if (bVar3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_1210,"!define MUI_FINISHPAGE_RUN \"$INSTDIR\\",&local_1211);
        std::allocator<char>::~allocator(&local_1211);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1238,"CPACK_NSIS_EXECUTABLES_DIRECTORY",&local_1239);
        pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_1238);
        std::__cxx11::string::operator+=(local_1210,pcVar5);
        std::__cxx11::string::~string((string *)&local_1238);
        std::allocator<char>::~allocator(&local_1239);
        std::__cxx11::string::operator+=(local_1210,"\\");
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1260,"CPACK_NSIS_MUI_FINISHPAGE_RUN",&local_1261);
        pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_1260);
        std::__cxx11::string::operator+=(local_1210,pcVar5);
        std::__cxx11::string::~string((string *)&local_1260);
        std::allocator<char>::~allocator(&local_1261);
        std::__cxx11::string::operator+=(local_1210,"\"\n");
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1288,"CPACK_NSIS_INSTALLER_MUI_FINISHPAGE_RUN_CODE",&local_1289)
        ;
        pcVar5 = (char *)std::__cxx11::string::c_str();
        cmCPackGenerator::SetOptionIfNotSet(&this->super_cmCPackGenerator,&local_1288,pcVar5);
        std::__cxx11::string::~string((string *)&local_1288);
        std::allocator<char>::~allocator(&local_1289);
        std::__cxx11::string::~string(local_1210);
      }
      bVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
              ::empty(&(this->super_cmCPackGenerator).Components);
      if (bVar3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_12b0,"CPACK_NSIS_INSTALLATION_TYPES",&local_12b1);
        cmCPackGenerator::SetOptionIfNotSet(&this->super_cmCPackGenerator,&local_12b0,"");
        std::__cxx11::string::~string((string *)&local_12b0);
        std::allocator<char>::~allocator(&local_12b1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_12d8,"CPACK_NSIS_INSTALLER_MUI_COMPONENTS_DESC",&local_12d9);
        cmCPackGenerator::SetOptionIfNotSet(&this->super_cmCPackGenerator,&local_12d8,"");
        std::__cxx11::string::~string((string *)&local_12d8);
        std::allocator<char>::~allocator(&local_12d9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1300,"CPACK_NSIS_PAGE_COMPONENTS",&local_1301);
        cmCPackGenerator::SetOptionIfNotSet(&this->super_cmCPackGenerator,&local_1300,"");
        std::__cxx11::string::~string((string *)&local_1300);
        std::allocator<char>::~allocator(&local_1301);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1328,"CPACK_NSIS_FULL_INSTALL",&local_1329);
        cmCPackGenerator::SetOptionIfNotSet
                  (&this->super_cmCPackGenerator,&local_1328,"File /r \"${INST_DIR}\\*.*\"");
        std::__cxx11::string::~string((string *)&local_1328);
        std::allocator<char>::~allocator(&local_1329);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1350,"CPACK_NSIS_COMPONENT_SECTIONS",&local_1351);
        cmCPackGenerator::SetOptionIfNotSet(&this->super_cmCPackGenerator,&local_1350,"");
        std::__cxx11::string::~string((string *)&local_1350);
        std::allocator<char>::~allocator(&local_1351);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1378,"CPACK_NSIS_COMPONENT_SECTION_LIST",&local_1379);
        cmCPackGenerator::SetOptionIfNotSet(&this->super_cmCPackGenerator,&local_1378,"");
        std::__cxx11::string::~string((string *)&local_1378);
        std::allocator<char>::~allocator(&local_1379);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_13a0,"CPACK_NSIS_SECTION_SELECTED_VARS",
                   (allocator<char> *)(componentCode.field_2._M_local_buf + 0xf));
        cmCPackGenerator::SetOptionIfNotSet(&this->super_cmCPackGenerator,&local_13a0,"");
        std::__cxx11::string::~string((string *)&local_13a0);
        std::allocator<char>::~allocator
                  ((allocator<char> *)(componentCode.field_2._M_local_buf + 0xf));
      }
      else {
        std::__cxx11::string::string((string *)(sectionList.field_2._M_local_buf + 8));
        std::__cxx11::string::string((string *)(selectedVarsList.field_2._M_local_buf + 8));
        std::__cxx11::string::string((string *)(componentDescriptions.field_2._M_local_buf + 8));
        std::__cxx11::string::string((string *)(groupDescriptions.field_2._M_local_buf + 8));
        std::__cxx11::string::string((string *)(installTypesCode.field_2._M_local_buf + 8));
        std::__cxx11::string::string((string *)(defines.field_2._M_local_buf + 8));
        std::__cxx11::string::string(local_1488);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1600);
        installTypes.
        super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
        __n = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackInstallationType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackInstallationType>_>_>
              ::size(&(this->super_cmCPackGenerator).InstallationTypes);
        std::allocator<cmCPackInstallationType_*>::allocator
                  ((allocator<cmCPackInstallationType_*> *)((long)&__range2 + 7));
        std::vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>::vector
                  ((vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_> *)
                   local_1620,__n,(allocator<cmCPackInstallationType_*> *)((long)&__range2 + 7));
        std::allocator<cmCPackInstallationType_*>::~allocator
                  ((allocator<cmCPackInstallationType_*> *)((long)&__range2 + 7));
        this_01 = &(this->super_cmCPackGenerator).InstallationTypes;
        __end2 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackInstallationType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackInstallationType>_>_>
                 ::begin(this_01);
        installType = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackInstallationType>
                       *)std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackInstallationType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackInstallationType>_>_>
                         ::end(this_01);
        while (bVar3 = std::operator!=(&__end2,(_Self *)&installType), bVar3) {
          ppVar8 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackInstallationType>_>
                   ::operator*(&__end2);
          ppcVar9 = std::
                    vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>::
                    operator[]((vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>
                                *)local_1620,(ulong)((ppVar8->second).Index - 1));
          *ppcVar9 = &ppVar8->second;
          std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackInstallationType>_>
          ::operator++(&__end2);
        }
        __end2_1 = std::
                   vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>::
                   begin((vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>
                          *)local_1620);
        installType_1 =
             (cmCPackInstallationType *)
             std::vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>::end
                       ((vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>
                         *)local_1620);
        while (bVar3 = __gnu_cxx::operator!=
                                 (&__end2_1,
                                  (__normal_iterator<cmCPackInstallationType_**,_std::vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>_>
                                   *)&installType_1), bVar3) {
          ppcVar10 = __gnu_cxx::
                     __normal_iterator<cmCPackInstallationType_**,_std::vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>_>
                     ::operator*(&__end2_1);
          pcVar2 = *ppcVar10;
          std::__cxx11::string::operator+=
                    ((string *)(defines.field_2._M_local_buf + 8),"InstType \"");
          std::__cxx11::string::operator+=
                    ((string *)(defines.field_2._M_local_buf + 8),(string *)&pcVar2->DisplayName);
          std::__cxx11::string::operator+=((string *)(defines.field_2._M_local_buf + 8),"\"\n");
          __gnu_cxx::
          __normal_iterator<cmCPackInstallationType_**,_std::vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>_>
          ::operator++(&__end2_1);
        }
        this_02 = &(this->super_cmCPackGenerator).ComponentGroups;
        __end2_2 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>_>_>
                   ::begin(this_02);
        group = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>
                 *)std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>_>_>
                   ::end(this_02);
        while (bVar3 = std::operator!=(&__end2_2,(_Self *)&group), bVar3) {
          local_1688 = std::
                       _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>_>
                       ::operator*(&__end2_2);
          if ((local_1688->second).ParentGroup == (cmCPackComponentGroup *)0x0) {
            CreateComponentGroupDescription_abi_cxx11_
                      (&local_16a8,this,&local_1688->second,(ostream *)local_1600);
            std::__cxx11::string::operator+=
                      ((string *)(sectionList.field_2._M_local_buf + 8),(string *)&local_16a8);
            std::__cxx11::string::~string((string *)&local_16a8);
          }
          uVar4 = std::__cxx11::string::empty();
          if ((uVar4 & 1) == 0) {
            std::operator+(&local_1728,"  !insertmacro MUI_DESCRIPTION_TEXT ${",&local_1688->first);
            std::operator+(&local_1708,&local_1728,"} \"");
            std::__cxx11::string::string
                      ((string *)&__range2_3,(string *)&(local_1688->second).Description);
            TranslateNewlines(&local_1748,(string *)&__range2_3);
            std::operator+(&local_16e8,&local_1708,&local_1748);
            std::operator+(&local_16c8,&local_16e8,"\"\n");
            std::__cxx11::string::operator+=
                      ((string *)(installTypesCode.field_2._M_local_buf + 8),(string *)&local_16c8);
            std::__cxx11::string::~string((string *)&local_16c8);
            std::__cxx11::string::~string((string *)&local_16e8);
            std::__cxx11::string::~string((string *)&local_1748);
            std::__cxx11::string::~string((string *)&__range2_3);
            std::__cxx11::string::~string((string *)&local_1708);
            std::__cxx11::string::~string((string *)&local_1728);
          }
          std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>_>
          ::operator++(&__end2_2);
        }
        this_03 = &(this->super_cmCPackGenerator).Components;
        __end2_3 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
                   ::begin(this_03);
        comp = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>
                *)std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
                  ::end(this_03);
        while (bVar3 = std::operator!=(&__end2_3,(_Self *)&comp), bVar3) {
          local_1788 = std::
                       _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
                       ::operator*(&__end2_3);
          bVar3 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::empty(&(local_1788->second).Files);
          if (!bVar3) {
            local_23e1 = 1;
            if ((installTypes.
                 super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
              local_23e1 = (byte)(local_1788->second).field_0x48 >> 3 & 1;
            }
            installTypes.
            super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = local_23e1;
            if ((local_1788->second).Group == (cmCPackComponentGroup *)0x0) {
              CreateComponentDescription_abi_cxx11_
                        (&local_17a8,this,&local_1788->second,(ostream *)local_1600);
              std::__cxx11::string::operator+=
                        ((string *)(sectionList.field_2._M_local_buf + 8),(string *)&local_17a8);
              std::__cxx11::string::~string((string *)&local_17a8);
            }
            std::__cxx11::string::operator+=
                      ((string *)(selectedVarsList.field_2._M_local_buf + 8),
                       "  !insertmacro \"${MacroName}\" \"");
            std::__cxx11::string::operator+=
                      ((string *)(selectedVarsList.field_2._M_local_buf + 8),(string *)local_1788);
            std::__cxx11::string::operator+=
                      ((string *)(selectedVarsList.field_2._M_local_buf + 8),"\"\n");
            std::operator+(&local_17e8,"Var ",&local_1788->first);
            std::operator+(&local_17c8,&local_17e8,"_selected\n");
            std::__cxx11::string::operator+=
                      ((string *)(componentDescriptions.field_2._M_local_buf + 8),
                       (string *)&local_17c8);
            std::__cxx11::string::~string((string *)&local_17c8);
            std::__cxx11::string::~string((string *)&local_17e8);
            std::operator+(&local_1828,"Var ",&local_1788->first);
            std::operator+(&local_1808,&local_1828,"_was_installed\n");
            std::__cxx11::string::operator+=
                      ((string *)(componentDescriptions.field_2._M_local_buf + 8),
                       (string *)&local_1808);
            std::__cxx11::string::~string((string *)&local_1808);
            std::__cxx11::string::~string((string *)&local_1828);
            uVar4 = std::__cxx11::string::empty();
            if ((uVar4 & 1) == 0) {
              std::operator+(&local_18a8,"  !insertmacro MUI_DESCRIPTION_TEXT ${",&local_1788->first
                            );
              std::operator+(&local_1888,&local_18a8,"} \"");
              std::__cxx11::string::string
                        ((string *)&local_18e8,(string *)&(local_1788->second).Description);
              TranslateNewlines(&local_18c8,&local_18e8);
              std::operator+(&local_1868,&local_1888,&local_18c8);
              std::operator+(&local_1848,&local_1868,"\"\n");
              std::__cxx11::string::operator+=
                        ((string *)(groupDescriptions.field_2._M_local_buf + 8),
                         (string *)&local_1848);
              std::__cxx11::string::~string((string *)&local_1848);
              std::__cxx11::string::~string((string *)&local_1868);
              std::__cxx11::string::~string((string *)&local_18c8);
              std::__cxx11::string::~string((string *)&local_18e8);
              std::__cxx11::string::~string((string *)&local_1888);
              std::__cxx11::string::~string((string *)&local_18a8);
            }
          }
          std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
          ::operator++(&__end2_3);
        }
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator+=
                  ((string *)(sectionList.field_2._M_local_buf + 8),local_1908);
        std::__cxx11::string::~string(local_1908);
        uVar4 = std::__cxx11::string::empty();
        if (((uVar4 & 1) == 0) || (uVar4 = std::__cxx11::string::empty(), (uVar4 & 1) == 0)) {
          std::operator+(&local_1990,"!insertmacro MUI_FUNCTION_DESCRIPTION_BEGIN\n",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&groupDescriptions.field_2 + 8));
          std::operator+(&local_1970,&local_1990,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&installTypesCode.field_2 + 8));
          std::operator+(&local_1950,&local_1970,"!insertmacro MUI_FUNCTION_DESCRIPTION_END\n");
          std::__cxx11::string::operator=
                    ((string *)(groupDescriptions.field_2._M_local_buf + 8),(string *)&local_1950);
          std::__cxx11::string::~string((string *)&local_1950);
          std::__cxx11::string::~string((string *)&local_1970);
          std::__cxx11::string::~string((string *)&local_1990);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_19b0,"CPACK_NSIS_INSTALLER_MUI_COMPONENTS_DESC",&local_19b1);
          pcVar5 = (char *)std::__cxx11::string::c_str();
          cmCPackGenerator::SetOptionIfNotSet(&this->super_cmCPackGenerator,&local_19b0,pcVar5);
          std::__cxx11::string::~string((string *)&local_19b0);
          std::allocator<char>::~allocator(&local_19b1);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1928,"CPACK_NSIS_INSTALLER_MUI_COMPONENTS_DESC",&local_1929);
          cmCPackGenerator::SetOptionIfNotSet
                    (&this->super_cmCPackGenerator,&local_1928,"!define MUI_COMPONENTSPAGE_NODESC");
          std::__cxx11::string::~string((string *)&local_1928);
          std::allocator<char>::~allocator(&local_1929);
        }
        if ((installTypes.
             super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
          std::__cxx11::string::operator+=(local_1488,"!define CPACK_USES_DOWNLOAD\n");
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_19d8,"CPACK_ADD_REMOVE",&local_19d9);
          pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_19d8);
          bVar3 = cmSystemTools::IsOn(pcVar5);
          std::__cxx11::string::~string((string *)&local_19d8);
          std::allocator<char>::~allocator(&local_19d9);
          if (bVar3) {
            std::__cxx11::string::operator+=(local_1488,"!define CPACK_NSIS_ADD_REMOVE\n");
          }
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1a00,"CPACK_NSIS_INSTALLATION_TYPES",&local_1a01);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        cmCPackGenerator::SetOptionIfNotSet(&this->super_cmCPackGenerator,&local_1a00,pcVar5);
        std::__cxx11::string::~string((string *)&local_1a00);
        std::allocator<char>::~allocator(&local_1a01);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1a28,"CPACK_NSIS_PAGE_COMPONENTS",&local_1a29);
        cmCPackGenerator::SetOptionIfNotSet
                  (&this->super_cmCPackGenerator,&local_1a28,"!insertmacro MUI_PAGE_COMPONENTS");
        std::__cxx11::string::~string((string *)&local_1a28);
        std::allocator<char>::~allocator(&local_1a29);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1a50,"CPACK_NSIS_FULL_INSTALL",&local_1a51);
        cmCPackGenerator::SetOptionIfNotSet(&this->super_cmCPackGenerator,&local_1a50,"");
        std::__cxx11::string::~string((string *)&local_1a50);
        std::allocator<char>::~allocator(&local_1a51);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1a78,"CPACK_NSIS_COMPONENT_SECTIONS",&local_1a79);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        cmCPackGenerator::SetOptionIfNotSet(&this->super_cmCPackGenerator,&local_1a78,pcVar5);
        std::__cxx11::string::~string((string *)&local_1a78);
        std::allocator<char>::~allocator(&local_1a79);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1aa0,"CPACK_NSIS_COMPONENT_SECTION_LIST",&local_1aa1);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        cmCPackGenerator::SetOptionIfNotSet(&this->super_cmCPackGenerator,&local_1aa0,pcVar5);
        std::__cxx11::string::~string((string *)&local_1aa0);
        std::allocator<char>::~allocator(&local_1aa1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1ac8,"CPACK_NSIS_SECTION_SELECTED_VARS",&local_1ac9);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        cmCPackGenerator::SetOptionIfNotSet(&this->super_cmCPackGenerator,&local_1ac8,pcVar5);
        std::__cxx11::string::~string((string *)&local_1ac8);
        std::allocator<char>::~allocator(&local_1ac9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1af0,"CPACK_NSIS_DEFINES",
                   (allocator<char> *)(nsisCmd.field_2._M_local_buf + 0xf));
        pcVar5 = (char *)std::__cxx11::string::c_str();
        cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,&local_1af0,pcVar5);
        std::__cxx11::string::~string((string *)&local_1af0);
        std::allocator<char>::~allocator((allocator<char> *)(nsisCmd.field_2._M_local_buf + 0xf));
        std::vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>::~vector
                  ((vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_> *)
                   local_1620);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1600);
        std::__cxx11::string::~string(local_1488);
        std::__cxx11::string::~string((string *)(defines.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(installTypesCode.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(groupDescriptions.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(componentDescriptions.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(selectedVarsList.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(sectionList.field_2._M_local_buf + 8));
      }
      (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[0xd])(this,local_208,local_428,0);
      (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[0xd])(this,local_38,local_3c0,0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_1b18,"\"",&local_1b19);
      std::allocator<char>::~allocator(&local_1b19);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1b40,"CPACK_INSTALLER_PROGRAM",&local_1b41);
      pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_1b40);
      std::__cxx11::string::operator+=((string *)local_1b18,pcVar5);
      std::__cxx11::string::~string((string *)&local_1b40);
      std::allocator<char>::~allocator(&local_1b41);
      std::operator+(&local_1b88,"\" \"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0)
      ;
      std::operator+(&local_1b68,&local_1b88,"\"");
      std::__cxx11::string::operator+=((string *)local_1b18,(string *)&local_1b68);
      std::__cxx11::string::~string((string *)&local_1b68);
      std::__cxx11::string::~string((string *)&local_1b88);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d00);
      poVar6 = std::operator<<((ostream *)local_1d00,"Execute: ");
      poVar6 = std::operator<<(poVar6,(string *)local_1b18);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCPackGenerator).Logger;
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmCPackLog::Log(pcVar1,2,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackNSISGenerator.cxx"
                      ,300,pcVar5);
      std::__cxx11::string::~string((string *)(output.field_2._M_local_buf + 8));
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d00);
      std::__cxx11::string::string((string *)local_1d40);
      local_1d44 = 1;
      outputflag = (this->super_cmCPackGenerator).GeneratorVerbose;
      ofs._576_8_ = std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
      bVar3 = cmSystemTools::RunSingleCommand
                        ((string *)local_1b18,(string *)local_1d40,(string *)local_1d40,&local_1d44,
                         (char *)0x0,outputflag,(cmDuration)ofs._576_8_);
      if ((bVar3) && (local_1d44 == 0)) {
        this_local._4_4_ = 1;
        nsisInInstallOptions.field_2._12_4_ = 1;
      }
      else {
        cmGeneratedFileStream::cmGeneratedFileStream
                  ((cmGeneratedFileStream *)local_1f98,
                   (string *)((long)&nsisInstallOptions.field_2 + 8),false,None);
        poVar6 = std::operator<<((ostream *)local_1f98,"# Run command: ");
        poVar6 = std::operator<<(poVar6,(string *)local_1b18);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        poVar6 = std::operator<<(poVar6,"# Output:");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        poVar6 = std::operator<<(poVar6,(string *)local_1d40);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2110);
        poVar6 = std::operator<<((ostream *)local_2110,"Problem running NSIS command: ");
        poVar6 = std::operator<<(poVar6,(string *)local_1b18);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        poVar6 = std::operator<<(poVar6,"Please check ");
        poVar6 = std::operator<<(poVar6,(string *)(nsisInstallOptions.field_2._M_local_buf + 8));
        poVar6 = std::operator<<(poVar6," for errors");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCPackGenerator).Logger;
        std::__cxx11::ostringstream::str();
        pcVar5 = (char *)std::__cxx11::string::c_str();
        cmCPackLog::Log(pcVar1,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackNSISGenerator.cxx"
                        ,0x13b,pcVar5);
        std::__cxx11::string::~string(local_2130);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2110);
        this_local._4_4_ = 0;
        nsisInInstallOptions.field_2._12_4_ = 1;
        cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_1f98);
      }
      std::__cxx11::string::~string((string *)local_1d40);
      std::__cxx11::string::~string((string *)local_1b18);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&__range1_1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_8c0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&__range1);
      std::__cxx11::string::~string((string *)local_428);
      std::__cxx11::string::~string((string *)(nsisInstallOptions.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_3c0);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_380);
      poVar6 = std::operator<<((ostream *)local_380,
                               "CPack error: Could not find NSIS installer options file.");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCPackGenerator).Logger;
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmCPackLog::Log(pcVar1,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackNSISGenerator.cxx"
                      ,0x33,pcVar5);
      std::__cxx11::string::~string((string *)(nsisFileName.field_2._M_local_buf + 8));
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_380);
      this_local._4_4_ = 0;
      nsisInInstallOptions.field_2._12_4_ = 1;
    }
    std::__cxx11::string::~string(local_208);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
    poVar6 = std::operator<<((ostream *)local_1b0,
                             "CPack error: Could not find NSIS installer template file.");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log(pcVar1,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackNSISGenerator.cxx"
                    ,0x2b,pcVar5);
    std::__cxx11::string::~string(local_1e0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
    this_local._4_4_ = 0;
    nsisInInstallOptions.field_2._12_4_ = 1;
  }
  std::__cxx11::string::~string(local_38);
  return this_local._4_4_;
}

Assistant:

int cmCPackNSISGenerator::PackageFiles()
{
  // TODO: Fix nsis to force out file name

  std::string nsisInFileName = this->FindTemplate("NSIS.template.in");
  if (nsisInFileName.empty()) {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "CPack error: Could not find NSIS installer template file."
                    << std::endl);
    return false;
  }
  std::string nsisInInstallOptions =
    this->FindTemplate("NSIS.InstallOptions.ini.in");
  if (nsisInInstallOptions.empty()) {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "CPack error: Could not find NSIS installer options file."
                    << std::endl);
    return false;
  }

  std::string nsisFileName = this->GetOption("CPACK_TOPLEVEL_DIRECTORY");
  std::string tmpFile = nsisFileName;
  tmpFile += "/NSISOutput.log";
  std::string nsisInstallOptions = nsisFileName + "/NSIS.InstallOptions.ini";
  nsisFileName += "/project.nsi";
  std::ostringstream str;
  for (std::string const& file : files) {
    std::string outputDir = "$INSTDIR";
    std::string fileN = cmSystemTools::RelativePath(toplevel, file);
    if (!this->Components.empty()) {
      const std::string::size_type pos = fileN.find('/');

      // Use the custom component install directory if we have one
      if (pos != std::string::npos) {
        const std::string componentName = fileN.substr(0, pos);
        outputDir = CustomComponentInstallDirectory(componentName);
      } else {
        outputDir = CustomComponentInstallDirectory(fileN);
      }

      // Strip off the component part of the path.
      fileN = fileN.substr(pos + 1);
    }
    std::replace(fileN.begin(), fileN.end(), '/', '\\');

    str << "  Delete \"" << outputDir << "\\" << fileN << "\"" << std::endl;
  }
  cmCPackLogger(cmCPackLog::LOG_DEBUG,
                "Uninstall Files: " << str.str() << std::endl);
  this->SetOptionIfNotSet("CPACK_NSIS_DELETE_FILES", str.str().c_str());
  std::vector<std::string> dirs;
  this->GetListOfSubdirectories(toplevel.c_str(), dirs);
  std::ostringstream dstr;
  for (std::string const& dir : dirs) {
    std::string componentName;
    std::string fileN = cmSystemTools::RelativePath(toplevel, dir);
    if (fileN.empty()) {
      continue;
    }
    if (!Components.empty()) {
      // If this is a component installation, strip off the component
      // part of the path.
      std::string::size_type slash = fileN.find('/');
      if (slash != std::string::npos) {
        // If this is a component installation, determine which component it
        // is.
        componentName = fileN.substr(0, slash);

        // Strip off the component part of the path.
        fileN = fileN.substr(slash + 1);
      }
    }
    std::replace(fileN.begin(), fileN.end(), '/', '\\');

    const std::string componentOutputDir =
      CustomComponentInstallDirectory(componentName);

    dstr << "  RMDir \"" << componentOutputDir << "\\" << fileN << "\""
         << std::endl;
    if (!componentName.empty()) {
      this->Components[componentName].Directories.push_back(std::move(fileN));
    }
  }
  cmCPackLogger(cmCPackLog::LOG_DEBUG,
                "Uninstall Dirs: " << dstr.str() << std::endl);
  this->SetOptionIfNotSet("CPACK_NSIS_DELETE_DIRECTORIES", dstr.str().c_str());

  cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                "Configure file: " << nsisInFileName << " to " << nsisFileName
                                   << std::endl);
  if (this->IsSet("CPACK_NSIS_MUI_ICON") ||
      this->IsSet("CPACK_NSIS_MUI_UNIICON")) {
    std::string installerIconCode;
    if (this->IsSet("CPACK_NSIS_MUI_ICON")) {
      installerIconCode += "!define MUI_ICON \"";
      installerIconCode += this->GetOption("CPACK_NSIS_MUI_ICON");
      installerIconCode += "\"\n";
    }
    if (this->IsSet("CPACK_NSIS_MUI_UNIICON")) {
      installerIconCode += "!define MUI_UNICON \"";
      installerIconCode += this->GetOption("CPACK_NSIS_MUI_UNIICON");
      installerIconCode += "\"\n";
    }
    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_MUI_ICON_CODE",
                            installerIconCode.c_str());
  }
  if (this->IsSet("CPACK_PACKAGE_ICON")) {
    std::string installerIconCode = "!define MUI_HEADERIMAGE_BITMAP \"";
    installerIconCode += this->GetOption("CPACK_PACKAGE_ICON");
    installerIconCode += "\"\n";
    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_ICON_CODE",
                            installerIconCode.c_str());
  }

  if (this->IsSet("CPACK_NSIS_MUI_WELCOMEFINISHPAGE_BITMAP")) {
    std::string installerBitmapCode =
      "!define MUI_WELCOMEFINISHPAGE_BITMAP \"";
    installerBitmapCode +=
      this->GetOption("CPACK_NSIS_MUI_WELCOMEFINISHPAGE_BITMAP");
    installerBitmapCode += "\"\n";
    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_MUI_WELCOMEFINISH_CODE",
                            installerBitmapCode.c_str());
  }

  if (this->IsSet("CPACK_NSIS_MUI_UNWELCOMEFINISHPAGE_BITMAP")) {
    std::string installerBitmapCode =
      "!define MUI_UNWELCOMEFINISHPAGE_BITMAP \"";
    installerBitmapCode +=
      this->GetOption("CPACK_NSIS_MUI_UNWELCOMEFINISHPAGE_BITMAP");
    installerBitmapCode += "\"\n";
    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_MUI_UNWELCOMEFINISH_CODE",
                            installerBitmapCode.c_str());
  }

  if (this->IsSet("CPACK_NSIS_MUI_FINISHPAGE_RUN")) {
    std::string installerRunCode = "!define MUI_FINISHPAGE_RUN \"$INSTDIR\\";
    installerRunCode += this->GetOption("CPACK_NSIS_EXECUTABLES_DIRECTORY");
    installerRunCode += "\\";
    installerRunCode += this->GetOption("CPACK_NSIS_MUI_FINISHPAGE_RUN");
    installerRunCode += "\"\n";
    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_MUI_FINISHPAGE_RUN_CODE",
                            installerRunCode.c_str());
  }

  // Setup all of the component sections
  if (this->Components.empty()) {
    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLATION_TYPES", "");
    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_MUI_COMPONENTS_DESC", "");
    this->SetOptionIfNotSet("CPACK_NSIS_PAGE_COMPONENTS", "");
    this->SetOptionIfNotSet("CPACK_NSIS_FULL_INSTALL",
                            R"(File /r "${INST_DIR}\*.*")");
    this->SetOptionIfNotSet("CPACK_NSIS_COMPONENT_SECTIONS", "");
    this->SetOptionIfNotSet("CPACK_NSIS_COMPONENT_SECTION_LIST", "");
    this->SetOptionIfNotSet("CPACK_NSIS_SECTION_SELECTED_VARS", "");
  } else {
    std::string componentCode;
    std::string sectionList;
    std::string selectedVarsList;
    std::string componentDescriptions;
    std::string groupDescriptions;
    std::string installTypesCode;
    std::string defines;
    std::ostringstream macrosOut;
    bool anyDownloadedComponents = false;

    // Create installation types. The order is significant, so we first fill
    // in a vector based on the indices, and print them in that order.
    std::vector<cmCPackInstallationType*> installTypes(
      this->InstallationTypes.size());
    for (auto& installType : this->InstallationTypes) {
      installTypes[installType.second.Index - 1] = &installType.second;
    }
    for (cmCPackInstallationType* installType : installTypes) {
      installTypesCode += "InstType \"";
      installTypesCode += installType->DisplayName;
      installTypesCode += "\"\n";
    }

    // Create installation groups first
    for (auto& group : this->ComponentGroups) {
      if (group.second.ParentGroup == nullptr) {
        componentCode +=
          this->CreateComponentGroupDescription(&group.second, macrosOut);
      }

      // Add the group description, if any.
      if (!group.second.Description.empty()) {
        groupDescriptions += "  !insertmacro MUI_DESCRIPTION_TEXT ${" +
          group.first + "} \"" +
          cmCPackNSISGenerator::TranslateNewlines(group.second.Description) +
          "\"\n";
      }
    }

    // Create the remaining components, which aren't associated with groups.
    for (auto& comp : this->Components) {
      if (comp.second.Files.empty()) {
        // NSIS cannot cope with components that have no files.
        continue;
      }

      anyDownloadedComponents =
        anyDownloadedComponents || comp.second.IsDownloaded;

      if (!comp.second.Group) {
        componentCode +=
          this->CreateComponentDescription(&comp.second, macrosOut);
      }

      // Add this component to the various section lists.
      sectionList += R"(  !insertmacro "${MacroName}" ")";
      sectionList += comp.first;
      sectionList += "\"\n";
      selectedVarsList += "Var " + comp.first + "_selected\n";
      selectedVarsList += "Var " + comp.first + "_was_installed\n";

      // Add the component description, if any.
      if (!comp.second.Description.empty()) {
        componentDescriptions += "  !insertmacro MUI_DESCRIPTION_TEXT ${" +
          comp.first + "} \"" +
          cmCPackNSISGenerator::TranslateNewlines(comp.second.Description) +
          "\"\n";
      }
    }

    componentCode += macrosOut.str();

    if (componentDescriptions.empty() && groupDescriptions.empty()) {
      // Turn off the "Description" box
      this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_MUI_COMPONENTS_DESC",
                              "!define MUI_COMPONENTSPAGE_NODESC");
    } else {
      componentDescriptions = "!insertmacro MUI_FUNCTION_DESCRIPTION_BEGIN\n" +
        componentDescriptions + groupDescriptions +
        "!insertmacro MUI_FUNCTION_DESCRIPTION_END\n";
      this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_MUI_COMPONENTS_DESC",
                              componentDescriptions.c_str());
    }

    if (anyDownloadedComponents) {
      defines += "!define CPACK_USES_DOWNLOAD\n";
      if (cmSystemTools::IsOn(this->GetOption("CPACK_ADD_REMOVE"))) {
        defines += "!define CPACK_NSIS_ADD_REMOVE\n";
      }
    }

    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLATION_TYPES",
                            installTypesCode.c_str());
    this->SetOptionIfNotSet("CPACK_NSIS_PAGE_COMPONENTS",
                            "!insertmacro MUI_PAGE_COMPONENTS");
    this->SetOptionIfNotSet("CPACK_NSIS_FULL_INSTALL", "");
    this->SetOptionIfNotSet("CPACK_NSIS_COMPONENT_SECTIONS",
                            componentCode.c_str());
    this->SetOptionIfNotSet("CPACK_NSIS_COMPONENT_SECTION_LIST",
                            sectionList.c_str());
    this->SetOptionIfNotSet("CPACK_NSIS_SECTION_SELECTED_VARS",
                            selectedVarsList.c_str());
    this->SetOption("CPACK_NSIS_DEFINES", defines.c_str());
  }

  this->ConfigureFile(nsisInInstallOptions, nsisInstallOptions);
  this->ConfigureFile(nsisInFileName, nsisFileName);
  std::string nsisCmd = "\"";
  nsisCmd += this->GetOption("CPACK_INSTALLER_PROGRAM");
  nsisCmd += "\" \"" + nsisFileName + "\"";
  cmCPackLogger(cmCPackLog::LOG_VERBOSE, "Execute: " << nsisCmd << std::endl);
  std::string output;
  int retVal = 1;
  bool res = cmSystemTools::RunSingleCommand(
    nsisCmd, &output, &output, &retVal, nullptr, this->GeneratorVerbose,
    cmDuration::zero());
  if (!res || retVal) {
    cmGeneratedFileStream ofs(tmpFile);
    ofs << "# Run command: " << nsisCmd << std::endl
        << "# Output:" << std::endl
        << output << std::endl;
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "Problem running NSIS command: " << nsisCmd << std::endl
                                                   << "Please check "
                                                   << tmpFile << " for errors"
                                                   << std::endl);
    return 0;
  }
  return 1;
}